

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

void gf_cond_sel(gf_s *x,gf_s *y,gf_s *z,mask_t is_z)

{
  uint64_t uVar1;
  uint64_t in_RCX;
  uint64_t in_RDX;
  uint64_t in_RSI;
  long in_RDI;
  size_t i;
  undefined8 local_28;
  
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    uVar1 = constant_time_select_64(in_RSI,in_RDX,in_RCX);
    *(uint64_t *)(in_RDI + local_28 * 8) = uVar1;
  }
  return;
}

Assistant:

static ossl_inline void gf_cond_sel(gf x, const gf y, const gf z, mask_t is_z)
{
    size_t i;

    for (i = 0; i < NLIMBS; i++) {
#if ARCH_WORD_BITS == 32
        x[0].limb[i] = constant_time_select_32(is_z, z[0].limb[i],
                                               y[0].limb[i]);
#else
        /* Must be 64 bit */
        x[0].limb[i] = constant_time_select_64(is_z, z[0].limb[i],
                                               y[0].limb[i]);
#endif
    }
}